

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_util.cpp
# Opt level: O3

void duckdb::regexp_util::ParseRegexOptions(string *options,Options *result,bool *global_replace)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  InvalidInputException *pIVar4;
  size_type sVar5;
  string local_48;
  
  sVar2 = options->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (options->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      switch(bVar1) {
      case 99:
        result->case_sensitive_ = true;
        break;
      case 100:
      case 0x65:
      case 0x66:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6f:
      case 0x71:
      case 0x72:
switchD_0178a65b_caseD_64:
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Unrecognized Regex option %c","");
        InvalidInputException::InvalidInputException<char>
                  (pIVar4,&local_48,(options->_M_dataplus)._M_p[sVar5]);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      case 0x67:
        if (global_replace == (bool *)0x0) {
          pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,
                     "Option \'g\' (global replace) is only valid for regexp_replace","");
          InvalidInputException::InvalidInputException(pIVar4,&local_48);
          __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        *global_replace = true;
        break;
      case 0x69:
        result->case_sensitive_ = false;
        break;
      case 0x6c:
        result->literal_ = true;
        break;
      case 0x6d:
      case 0x6e:
      case 0x70:
        result->dot_nl_ = false;
        break;
      case 0x73:
        result->dot_nl_ = true;
        break;
      default:
        if ((0x20 < bVar1) || ((0x100000600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
        goto switchD_0178a65b_caseD_64;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return;
}

Assistant:

void ParseRegexOptions(const string &options, duckdb_re2::RE2::Options &result, bool *global_replace) {
	for (idx_t i = 0; i < options.size(); i++) {
		switch (options[i]) {
		case 'c':
			// case-sensitive matching
			result.set_case_sensitive(true);
			break;
		case 'i':
			// case-insensitive matching
			result.set_case_sensitive(false);
			break;
		case 'l':
			// literal matching
			result.set_literal(true);
			break;
		case 'm':
		case 'n':
		case 'p':
			// newline-sensitive matching
			result.set_dot_nl(false);
			break;
		case 's':
			// non-newline-sensitive matching
			result.set_dot_nl(true);
			break;
		case 'g':
			// global replace, only available for regexp_replace
			if (global_replace) {
				*global_replace = true;
			} else {
				throw InvalidInputException("Option 'g' (global replace) is only valid for regexp_replace");
			}
			break;
		case ' ':
		case '\t':
		case '\n':
			// ignore whitespace
			break;
		default:
			throw InvalidInputException("Unrecognized Regex option %c", options[i]);
		}
	}
}